

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::String::_opFormat(String *this,ModifyOp op,char *fmt,...)

{
  char in_AL;
  Error EVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  Error err;
  __va_list_tag *in_stack_000003a0;
  char *in_stack_000003a8;
  ModifyOp in_stack_000003b4;
  String *in_stack_000003b8;
  undefined1 auStack_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  local_28 = auStack_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  EVar1 = _opVFormat(in_stack_000003b8,in_stack_000003b4,in_stack_000003a8,in_stack_000003a0);
  return EVar1;
}

Assistant:

Error String::_opFormat(ModifyOp op, const char* fmt, ...) noexcept {
  Error err;
  va_list ap;

  va_start(ap, fmt);
  err = _opVFormat(op, fmt, ap);
  va_end(ap);

  return err;
}